

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_find_sibling_opaq_next(lyd_node *first,char *name,lyd_node **match)

{
  lyd_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  
  if (name == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name",
           "lyd_find_sibling_opaq_next");
    return LY_EINVAL;
  }
  LVar3 = LY_ENOTFOUND;
  if (first != (lyd_node *)0x0) {
    if (first->schema != (lysc_node *)0x0) {
      plVar1 = first->prev;
      if (first->prev->schema != (lysc_node *)0x0) goto LAB_00123f03;
      do {
        first = plVar1;
        plVar1 = first->prev;
      } while (first->prev->schema == (lysc_node *)0x0);
    }
    do {
      if (first->schema != (lysc_node *)0x0) {
        __assert_fail("!first->schema",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                      ,0xcce,
                      "LY_ERR lyd_find_sibling_opaq_next(const struct lyd_node *, const char *, struct lyd_node **)"
                     );
      }
      iVar2 = strcmp((char *)first[1].schema,name);
      if (iVar2 == 0) {
        LVar3 = LY_SUCCESS;
        goto LAB_00123f06;
      }
      first = first->next;
    } while (first != (lyd_node *)0x0);
  }
LAB_00123f03:
  first = (lyd_node *)0x0;
LAB_00123f06:
  if (match != (lyd_node **)0x0) {
    *match = first;
  }
  return LVar3;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_find_sibling_opaq_next(const struct lyd_node *first, const char *name, struct lyd_node **match)
{
    LY_CHECK_ARG_RET(NULL, name, LY_EINVAL);

    if (first && first->schema) {
        first = first->prev;
        if (first->schema) {
            /* no opaque nodes */
            first = NULL;
        } else {
            /* opaque nodes are at the end, find quickly the first */
            while (!first->prev->schema) {
                first = first->prev;
            }
        }
    }

    for ( ; first; first = first->next) {
        assert(!first->schema);
        if (!strcmp(LYD_NAME(first), name)) {
            break;
        }
    }

    if (match) {
        *match = (struct lyd_node *)first;
    }
    return first ? LY_SUCCESS : LY_ENOTFOUND;
}